

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiHand::AddCard
          (HanabiHand *this,HanabiCard card,CardKnowledge *initial_knowledge)

{
  bool bVar1;
  value_type *in_RDX;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *in_RDI;
  HanabiCard local_8;
  
  bVar1 = HanabiCard::IsValid(&local_8);
  if (!bVar1) {
    __assert_fail("card.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                  ,0x52,
                  "void hanabi_learning_env::HanabiHand::AddCard(HanabiCard, const CardKnowledge &)"
                 );
  }
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  push_back(in_RDI,(value_type *)in_RDX);
  std::
  vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
  ::push_back((vector<hanabi_learning_env::HanabiHand::CardKnowledge,_std::allocator<hanabi_learning_env::HanabiHand::CardKnowledge>_>
               *)in_RDI,in_RDX);
  return;
}

Assistant:

void HanabiHand::AddCard(HanabiCard card,
                         const CardKnowledge& initial_knowledge) {
  REQUIRE(card.IsValid());
  cards_.push_back(card);
  card_knowledge_.push_back(initial_knowledge);
}